

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O0

int __thiscall r_memory_map::_get_posix_prot_flags(r_memory_map *this,int prot)

{
  uint local_18;
  int osProtFlags;
  int prot_local;
  r_memory_map *this_local;
  
  local_18 = (uint)((prot & 1U) != 0);
  if ((prot & 2U) != 0) {
    local_18 = local_18 | 2;
  }
  if ((prot & 4U) != 0) {
    local_18 = local_18 | 4;
  }
  return local_18;
}

Assistant:

int r_memory_map::_get_posix_prot_flags(int prot) const
{
    int osProtFlags = 0;

    if(prot & MM_PROT_READ)
        osProtFlags |= PROT_READ;
    if(prot & MM_PROT_WRITE)
        osProtFlags |= PROT_WRITE;
    if(prot & MM_PROT_EXEC)
        osProtFlags |= PROT_EXEC;

    return osProtFlags;
}